

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccelf.c
# Opt level: O3

void resolve_common_syms(TCCState *s1)

{
  int iVar1;
  size_t sVar2;
  unsigned_long uVar3;
  char *pcVar4;
  char cVar5;
  Section *pSVar6;
  long lVar7;
  uchar *puVar8;
  char local_438 [8];
  char buf [1024];
  
  uVar3 = symtab_section->data_offset;
  pSVar6 = symtab_section;
  if (0x18 < (long)uVar3) {
    puVar8 = symtab_section->data + 0x18;
    do {
      if (*(short *)(puVar8 + 6) == -0xe) {
        sVar2 = section_add(bss_section,*(Elf64_Addr *)(puVar8 + 0x10),*(int *)(puVar8 + 8));
        *(size_t *)(puVar8 + 8) = sVar2;
        *(short *)(puVar8 + 6) = (short)bss_section->sh_num;
        uVar3 = symtab_section->data_offset;
        pSVar6 = symtab_section;
      }
      puVar8 = puVar8 + 0x18;
    } while (puVar8 < pSVar6->data + uVar3);
  }
  set_elf_sym(pSVar6,text_section->data_offset,0,0x10,0,text_section->sh_num,"_etext");
  set_elf_sym(symtab_section,data_section->data_offset,0,0x10,0,data_section->sh_num,"_edata");
  set_elf_sym(symtab_section,bss_section->data_offset,0,0x10,0,bss_section->sh_num,"_end");
  add_init_array_defines(s1,".preinit_array");
  add_init_array_defines(s1,".init_array");
  add_init_array_defines(s1,".fini_array");
  iVar1 = s1->nb_sections;
  if (1 < iVar1) {
    lVar7 = 1;
    do {
      pSVar6 = s1->sections[lVar7];
      if ((pSVar6->sh_type == 1) && ((pSVar6->sh_flags & 2) != 0)) {
        cVar5 = pSVar6->name[0];
        if (cVar5 != '\0') {
          pcVar4 = &pSVar6->field_0x79;
          do {
            if (((int)cVar5 - 0x3aU < 0xfffffff6 && ((int)cVar5 & 0xffffffdfU) - 0x5b < 0xffffffe6)
                && cVar5 != '_') goto LAB_00110a19;
            cVar5 = *pcVar4;
            pcVar4 = pcVar4 + 1;
          } while (cVar5 != '\0');
        }
        snprintf(local_438,0x400,"__start_%s",pSVar6->name);
        set_elf_sym(symtab_section,0,0,0x10,0,pSVar6->sh_num,local_438);
        snprintf(local_438,0x400,"__stop_%s",pSVar6->name);
        set_elf_sym(symtab_section,pSVar6->data_offset,0,0x10,0,pSVar6->sh_num,local_438);
        iVar1 = s1->nb_sections;
      }
LAB_00110a19:
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar1);
  }
  return;
}

Assistant:

ST_FUNC void resolve_common_syms(TCCState* s1) {
  ElfW(Sym) * sym;

  /* Allocate common symbols in BSS.  */
  for_each_elem(symtab_section, 1, sym, ElfW(Sym)) {
    if (sym->st_shndx == SHN_COMMON) {
      /* symbol alignment is in st_value for SHN_COMMONs */
      sym->st_value = section_add(bss_section, sym->st_size, sym->st_value);
      sym->st_shndx = bss_section->sh_num;
    }
  }

  /* Now assign linker provided symbols their value.  */
  tcc_add_linker_symbols(s1);
}